

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

long cb_passthrough_resampler_duplex
               (cubeb_stream *param_1,void *user_ptr,void *input_buffer,void *output_buffer,
               long frame_count)

{
  check_duplex<float>((float *)input_buffer,(float *)output_buffer,frame_count,*user_ptr);
  return frame_count;
}

Assistant:

long cb_passthrough_resampler_duplex(cubeb_stream * /*stm*/, void * user_ptr,
                                     const void * input_buffer,
                                     void * output_buffer, long frame_count)
{
  closure * c = reinterpret_cast<closure*>(user_ptr);
  check_duplex<float>(static_cast<const float*>(input_buffer),
                      static_cast<float*>(output_buffer),
                      frame_count, c->input_channel_count);
  return frame_count;
}